

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int array_container_to_uint32_array(void *vout,array_container_t *cont,uint32_t base)

{
  uint uVar1;
  int in_EDX;
  int *in_RSI;
  long in_RDI;
  uint32_t val;
  size_t i;
  uint32_t *out;
  int outpos;
  int support;
  uint32_t in_stack_0000008c;
  size_t in_stack_00000090;
  uint16_t *in_stack_00000098;
  void *in_stack_000000a0;
  uint32_t in_stack_0000018c;
  size_t in_stack_00000190;
  uint16_t *in_stack_00000198;
  void *in_stack_000001a0;
  ulong local_38;
  int local_24;
  int local_4;
  
  uVar1 = croaring_hardware_support();
  if ((uVar1 & 2) == 0) {
    if ((uVar1 & 1) == 0) {
      local_24 = 0;
      for (local_38 = 0; local_38 < (ulong)(long)*in_RSI; local_38 = local_38 + 1) {
        *(uint *)(in_RDI + (long)local_24 * 4) =
             in_EDX + (uint)*(ushort *)(*(long *)(in_RSI + 2) + local_38 * 2);
        local_24 = local_24 + 1;
      }
      local_4 = local_24;
    }
    else {
      local_4 = array_container_to_uint32_array_vector16
                          (in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_0000008c);
    }
  }
  else {
    local_4 = avx512_array_container_to_uint32_array
                        (in_stack_000001a0,in_stack_00000198,in_stack_00000190,in_stack_0000018c);
  }
  return local_4;
}

Assistant:

ALLOW_UNALIGNED
int array_container_to_uint32_array(void *vout, const array_container_t *cont,
                                    uint32_t base) {
#if CROARING_IS_X64
    int support = croaring_hardware_support();
#if CROARING_COMPILER_SUPPORTS_AVX512
    if (support & ROARING_SUPPORTS_AVX512) {
        return avx512_array_container_to_uint32_array(vout, cont->array,
                                                      cont->cardinality, base);
    }
#endif
    if (support & ROARING_SUPPORTS_AVX2) {
        return array_container_to_uint32_array_vector16(
            vout, cont->array, cont->cardinality, base);
    }
#endif  // CROARING_IS_X64
    int outpos = 0;
    uint32_t *out = (uint32_t *)vout;
    size_t i = 0;
    for (; i < (size_t)cont->cardinality; ++i) {
        const uint32_t val = base + cont->array[i];
        memcpy(out + outpos, &val,
               sizeof(uint32_t));  // should be compiled as a MOV on x64
        outpos++;
    }
    return outpos;
}